

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.cc
# Opt level: O0

char * __thiscall
google::protobuf::internal::EpsCopyInputStream::ReadArenaString
          (EpsCopyInputStream *this,char *ptr,ArenaStringPtr *s,Arena *arena)

{
  uint32_t size_00;
  LogMessage *other;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str;
  LogFinisher local_7d;
  int size;
  byte local_69;
  LogMessage local_68;
  Arena *local_30;
  Arena *arena_local;
  ArenaStringPtr *s_local;
  char *ptr_local;
  EpsCopyInputStream *this_local;
  
  local_69 = 0;
  local_30 = arena;
  arena_local = (Arena *)s;
  s_local = (ArenaStringPtr *)ptr;
  ptr_local = (char *)this;
  if (arena == (Arena *)0x0) {
    LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/arenastring.cc"
               ,0x10c);
    local_69 = 1;
    other = LogMessage::operator<<(&local_68,"CHECK failed: arena != nullptr: ");
    LogFinisher::operator=(&local_7d,other);
  }
  if ((local_69 & 1) != 0) {
    LogMessage::~LogMessage(&local_68);
  }
  size_00 = ReadSize((char **)&s_local);
  if (s_local == (ArenaStringPtr *)0x0) {
    this_local = (EpsCopyInputStream *)0x0;
  }
  else {
    s_00 = Arena::Create<std::__cxx11::string>(local_30);
    s_local = (ArenaStringPtr *)ReadString(this,(char *)s_local,size_00,s_00);
    if (s_local == (ArenaStringPtr *)0x0) {
      this_local = (EpsCopyInputStream *)0x0;
    }
    else {
      SetStrWithHeapBuffer(s_00,(ArenaStringPtr *)arena_local);
      this_local = (EpsCopyInputStream *)s_local;
    }
  }
  return (char *)this_local;
}

Assistant:

const char* EpsCopyInputStream::ReadArenaString(const char* ptr,
                                                ArenaStringPtr* s,
                                                Arena* arena) {
  GOOGLE_DCHECK(arena != nullptr);

  int size = ReadSize(&ptr);
  if (!ptr) return nullptr;

  auto* str = Arena::Create<std::string>(arena);
  ptr = ReadString(ptr, size, str);
  GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);

  SetStrWithHeapBuffer(str, s);

  return ptr;
}